

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

void __thiscall
InitSocket::SetAddrNotifyCallback
          (InitSocket *this,
          function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
          *fnCbAddrNotify)

{
  int __args_2;
  bool bVar1;
  reference ptVar2;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_int,_int>_> *__args_1;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_int,_int>_> *p_Var3;
  __tuple_element_t<2UL,_tuple<basic_string<char>,_int,_int>_> *p_Var4;
  InitSocket *local_88;
  code *local_80;
  undefined8 local_78;
  thread local_70 [3];
  undefined1 local_58 [8];
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
  iter;
  iterator __end2;
  iterator __begin2;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  *__range2;
  function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
  *fnCbAddrNotify_local;
  InitSocket *this_local;
  
  std::
  function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
  ::operator=(&this->m_fnCbAddrNotify,fnCbAddrNotify);
  bVar1 = std::function::operator_cast_to_bool((function *)&this->m_fnCbAddrNotify);
  if (bVar1) {
    __end2 = std::
             vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
             ::begin(&this->m_vCurIPAddr);
    iter.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._8_8_ =
         std::
         vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
         ::end(&this->m_vCurIPAddr);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>_>
                                       *)((long)&iter.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                                 ._M_head_impl.field_2 + 8)), bVar1) {
      ptVar2 = __gnu_cxx::
               __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>_>
               ::operator*(&__end2);
      std::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
      ::tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
               *)local_58,ptVar2);
      __args_1 = std::get<0ul,std::__cxx11::string,int,int>
                           ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                             *)local_58);
      p_Var3 = std::get<1ul,std::__cxx11::string,int,int>
                         ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                           *)local_58);
      __args_2 = *p_Var3;
      p_Var4 = std::get<2ul,std::__cxx11::string,int,int>
                         ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                           *)local_58);
      std::
      function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
      ::operator()(&this->m_fnCbAddrNotify,true,__args_1,__args_2,*p_Var4);
      std::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
      ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                *)local_58);
      __gnu_cxx::
      __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>_>
      ::operator++(&__end2);
    }
  }
  bVar1 = std::thread::joinable(&this->m_thIpChange);
  if (!bVar1) {
    local_80 = IpChangeThread;
    local_78 = 0;
    local_88 = this;
    std::thread::thread<void(InitSocket::*)(),InitSocket*,void>
              (local_70,(type *)&local_80,&local_88);
    std::thread::operator=(&this->m_thIpChange,local_70);
    std::thread::~thread(local_70);
  }
  return;
}

Assistant:

void InitSocket::SetAddrNotifyCallback(const function<void(bool, const string&, int, int)>& fnCbAddrNotify)
{
    m_fnCbAddrNotify = fnCbAddrNotify;
    if (m_fnCbAddrNotify)
    {   // notify on current ip addresses
        for (auto iter : m_vCurIPAddr)
            m_fnCbAddrNotify(true, get<0>(iter), get<1>(iter), get<2>(iter));
    }

#if defined(_WIN32) || defined(_WIN64)
    if (m_hIFaceNotify == nullptr)
        NotifyIpInterfaceChange(AF_UNSPEC, IpIfaceChanged, this, TRUE, &m_hIFaceNotify);
#else
    if (m_thIpChange.joinable() == false)
        m_thIpChange = thread(&InitSocket::IpChangeThread, this);
#endif
}